

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O0

void __thiscall
CCollision::MovePoint
          (CCollision *this,vec2 *pInoutPos,vec2 *pInoutVel,float Elasticity,int *pBounces)

{
  long lVar1;
  bool bVar2;
  int *in_RCX;
  float *in_RDX;
  vector2_base<float> *in_RSI;
  vec2 in_RDI;
  long in_FS_OFFSET;
  float in_XMM0_Da;
  vector2_base<float> vVar3;
  int Affected;
  vec2 Vel;
  vec2 Pos;
  CCollision *in_stack_ffffffffffffff98;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 Flag;
  float in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  float x;
  vector2_base<float> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RCX != (int *)0x0) {
    *in_RCX = 0;
  }
  vVar3 = vector2_base<float>::operator+
                    (in_stack_ffffffffffffffb0,
                     (vector2_base<float> *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  bVar2 = CheckPoint(in_stack_ffffffffffffff98,in_RDI,0);
  Flag = in_RDI.field_1;
  if (bVar2) {
    x = 0.0;
    bVar2 = CheckPoint((CCollision *)vVar3,0.0,in_stack_ffffffffffffffa8,(int)Flag);
    if (bVar2) {
      *in_RDX = -in_XMM0_Da * *in_RDX;
      if (in_RCX != (int *)0x0) {
        *in_RCX = *in_RCX + 1;
      }
      x = (float)((int)x + 1);
    }
    bVar2 = CheckPoint((CCollision *)vVar3,x,in_stack_ffffffffffffffa8,(int)Flag);
    if (bVar2) {
      in_RDX[1] = -in_XMM0_Da * in_RDX[1];
      if (in_RCX != (int *)0x0) {
        *in_RCX = *in_RCX + 1;
      }
      x = (float)((int)x + 1);
    }
    if (x == 0.0) {
      *in_RDX = -in_XMM0_Da * *in_RDX;
      in_RDX[1] = -in_XMM0_Da * in_RDX[1];
    }
  }
  else {
    vVar3 = vector2_base<float>::operator+
                      ((vector2_base<float> *)vVar3,
                       (vector2_base<float> *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *in_RSI = vVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CCollision::MovePoint(vec2 *pInoutPos, vec2 *pInoutVel, float Elasticity, int *pBounces) const
{
	if(pBounces)
		*pBounces = 0;

	vec2 Pos = *pInoutPos;
	vec2 Vel = *pInoutVel;
	if(CheckPoint(Pos + Vel))
	{
		int Affected = 0;
		if(CheckPoint(Pos.x + Vel.x, Pos.y))
		{
			pInoutVel->x *= -Elasticity;
			if(pBounces)
				(*pBounces)++;
			Affected++;
		}

		if(CheckPoint(Pos.x, Pos.y + Vel.y))
		{
			pInoutVel->y *= -Elasticity;
			if(pBounces)
				(*pBounces)++;
			Affected++;
		}

		if(Affected == 0)
		{
			pInoutVel->x *= -Elasticity;
			pInoutVel->y *= -Elasticity;
		}
	}
	else
	{
		*pInoutPos = Pos + Vel;
	}
}